

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMP_Multilinear_64_out_32.h
# Opt level: O2

uint32_t __thiscall
PMP_Multilinear_Hasher_64_out_32::_hash_noRecursionNoInline_forLessThan8Chunks
          (PMP_Multilinear_Hasher_64_out_32 *this,uchar *chars,uint cnt)

{
  ULARGE_INTEGER__XX *coeff;
  random_data_for_MPSHF *prVar1;
  ULARGE_INTEGER__XX constTerm;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  uint uVar11;
  ushort *tail;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uchar *puVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_ZMM24 [64];
  undefined1 local_b0 [8];
  uint64_t ctr;
  uint64_t allValues [8];
  
  prVar1 = this->curr_rd;
  uVar21 = (ulong)(cnt >> 9);
  puVar15 = chars + 0xf0;
  for (uVar16 = 0; uVar16 != uVar21; uVar16 = uVar16 + 1) {
    auVar23 = vpxord_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
    auVar45 = ZEXT1664((undefined1  [16])0x0);
    uVar14 = 0;
    while( true ) {
      in_ZMM24 = ZEXT1664(auVar23);
      auVar44 = auVar45._0_16_;
      if (0x7f < uVar14) break;
      auVar24 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar1->random_coeff + uVar14 + 0x1c));
      auVar25 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(puVar15 + uVar14 * 4 + -0x80));
      auVar26 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(puVar15 + uVar14 * 4 + -0x70));
      auVar27 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(puVar15 + uVar14 * 4 + -0x50));
      auVar28 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(puVar15 + uVar14 * 4 + -0x40));
      auVar49 = vpmuludq_avx(*(undefined1 (*) [16])(puVar15 + uVar14 * 4 + -0xf0),
                             *(undefined1 (*) [16])(prVar1->random_coeff + uVar14));
      auVar7 = vpshufd_avx(*(undefined1 (*) [16])(prVar1->random_coeff + uVar14),0xf5);
      auVar8 = vpshufd_avx(*(undefined1 (*) [16])(puVar15 + uVar14 * 4 + -0xf0),0xf5);
      auVar44 = vpaddq_avx(auVar49,auVar44);
      auVar49 = vpsrlq_avx(auVar49,0x20);
      auVar7 = vpmuludq_avx(auVar8,auVar7);
      auVar29 = vpaddq_avx512vl(auVar49,auVar23);
      auVar48 = vpsrlq_avx(auVar7,0x20);
      auVar8 = vpmuludq_avx(*(undefined1 (*) [16])(puVar15 + uVar14 * 4 + -0xe0),
                            *(undefined1 (*) [16])(prVar1->random_coeff + uVar14 + 4));
      auVar23 = vpshufd_avx(*(undefined1 (*) [16])(prVar1->random_coeff + uVar14 + 4),0xf5);
      auVar49 = vpshufd_avx(*(undefined1 (*) [16])(puVar15 + uVar14 * 4 + -0xe0),0xf5);
      auVar50 = vpsrlq_avx(auVar8,0x20);
      auVar2 = vpmuludq_avx(auVar49,auVar23);
      auVar3 = vpmuludq_avx(*(undefined1 (*) [16])(puVar15 + uVar14 * 4 + -0xd0),
                            *(undefined1 (*) [16])(prVar1->random_coeff + uVar14 + 8));
      auVar23 = vpshufd_avx(*(undefined1 (*) [16])(prVar1->random_coeff + uVar14 + 8),0xf5);
      auVar49 = vpshufd_avx(*(undefined1 (*) [16])(puVar15 + uVar14 * 4 + -0xd0),0xf5);
      auVar4 = vpmuludq_avx(auVar49,auVar23);
      auVar5 = vpmuludq_avx(*(undefined1 (*) [16])(puVar15 + uVar14 * 4 + -0xc0),
                            *(undefined1 (*) [16])(prVar1->random_coeff + uVar14 + 0xc));
      auVar23 = vpaddq_avx(auVar29,auVar50);
      auVar49 = vpshufd_avx(*(undefined1 (*) [16])(prVar1->random_coeff + uVar14 + 0xc),0xf5);
      auVar29 = vpshufd_avx(*(undefined1 (*) [16])(puVar15 + uVar14 * 4 + -0xc0),0xf5);
      auVar29 = vpmuludq_avx(auVar29,auVar49);
      auVar49 = vpsrlq_avx(auVar3,0x20);
      auVar50 = vpsrlq_avx(auVar2,0x20);
      auVar49 = vpaddq_avx(auVar48,auVar49);
      auVar48 = vpsrlq_avx(auVar5,0x20);
      auVar23 = vpaddq_avx(auVar23,auVar49);
      auVar49 = vpaddq_avx(auVar50,auVar48);
      auVar48 = vpsrlq_avx(auVar4,0x20);
      auVar49 = vpaddq_avx(auVar49,auVar48);
      auVar23 = vpaddq_avx(auVar23,auVar49);
      auVar49 = vpsrlq_avx(auVar29,0x20);
      auVar48 = vpmuludq_avx(*(undefined1 (*) [16])(puVar15 + uVar14 * 4 + -0xb0),
                             *(undefined1 (*) [16])(prVar1->random_coeff + uVar14 + 0x10));
      auVar50 = vpsrlq_avx(auVar48,0x20);
      auVar49 = vpaddq_avx(auVar50,auVar49);
      auVar50 = vpshufd_avx(*(undefined1 (*) [16])(prVar1->random_coeff + uVar14 + 0x10),0xf5);
      auVar9 = vpshufd_avx(*(undefined1 (*) [16])(puVar15 + uVar14 * 4 + -0xb0),0xf5);
      auVar50 = vpmuludq_avx(auVar9,auVar50);
      auVar9 = vpmuludq_avx(*(undefined1 (*) [16])(puVar15 + uVar14 * 4 + -0xa0),
                            *(undefined1 (*) [16])(prVar1->random_coeff + uVar14 + 0x14));
      auVar30 = vpsrlq_avx512vl(auVar9,0x20);
      auVar51 = vpsrlq_avx(auVar50,0x20);
      auVar49 = vpaddq_avx512vl(auVar49,auVar30);
      auVar49 = vpaddq_avx(auVar49,auVar51);
      auVar31 = vpaddq_avx512vl(auVar23,auVar49);
      auVar23 = vpshufd_avx(*(undefined1 (*) [16])(prVar1->random_coeff + uVar14 + 0x14),0xf5);
      auVar49 = vpshufd_avx(*(undefined1 (*) [16])(puVar15 + uVar14 * 4 + -0xa0),0xf5);
      auVar30 = vpmuludq_avx(auVar49,auVar23);
      auVar49 = vpsrlq_avx(auVar30,0x20);
      auVar51 = vpmuludq_avx(*(undefined1 (*) [16])(puVar15 + uVar14 * 4 + -0x90),
                             *(undefined1 (*) [16])(prVar1->random_coeff + uVar14 + 0x18));
      auVar23 = vpsrlq_avx512vl(auVar51,0x20);
      auVar32 = vpaddq_avx512vl(auVar23,auVar49);
      auVar23 = vpshufd_avx(*(undefined1 (*) [16])(prVar1->random_coeff + uVar14 + 0x18),0xf5);
      auVar49 = vpshufd_avx(*(undefined1 (*) [16])(puVar15 + uVar14 * 4 + -0x90),0xf5);
      auVar6 = vpmuludq_avx(auVar49,auVar23);
      auVar33 = vpmuludq_avx512vl(auVar25,auVar24);
      auVar23 = vpsrlq_avx512vl(auVar33,0x20);
      auVar49 = vpsrlq_avx(auVar6,0x20);
      auVar23 = vpaddq_avx512vl(auVar32,auVar23);
      auVar23 = vpaddq_avx512vl(auVar23,auVar49);
      auVar49 = vpshufd_avx512vl(auVar24,0xf5);
      auVar24 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar1->random_coeff + uVar14 + 0x20));
      auVar25 = vpshufd_avx512vl(auVar25,0xf5);
      auVar25 = vpmuludq_avx512vl(auVar25,auVar49);
      auVar49 = vpsrlq_avx512vl(auVar25,0x20);
      auVar32 = vpmuludq_avx512vl(auVar26,auVar24);
      auVar34 = vpsrlq_avx512vl(auVar32,0x20);
      auVar23 = vpaddq_avx512vl(auVar23,auVar34);
      auVar34 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(puVar15 + uVar14 * 4 + -0x60));
      auVar23 = vpaddq_avx512vl(auVar31,auVar23);
      auVar24 = vpshufd_avx512vl(auVar24,0xf5);
      auVar26 = vpshufd_avx512vl(auVar26,0xf5);
      auVar31 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar1->random_coeff + uVar14 + 0x24));
      auVar24 = vpmuludq_avx512vl(auVar26,auVar24);
      auVar26 = vpsrlq_avx512vl(auVar24,0x20);
      auVar35 = vpmuludq_avx512vl(auVar34,auVar31);
      auVar36 = vpsrlq_avx512vl(auVar35,0x20);
      auVar49 = vpaddq_avx512vl(auVar49,auVar36);
      auVar49 = vpaddq_avx512vl(auVar49,auVar26);
      auVar26 = vpshufd_avx512vl(auVar34,0xf5);
      auVar34 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar1->random_coeff + uVar14 + 0x28));
      auVar31 = vpshufd_avx512vl(auVar31,0xf5);
      auVar26 = vpmuludq_avx512vl(auVar26,auVar31);
      auVar31 = vpsrlq_avx512vl(auVar26,0x20);
      auVar36 = vpmuludq_avx512vl(auVar27,auVar34);
      auVar37 = vpsrlq_avx512vl(auVar36,0x20);
      auVar49 = vpaddq_avx512vl(auVar49,auVar37);
      auVar37 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar1->random_coeff + uVar14 + 0x2c));
      auVar49 = vpaddq_avx512vl(auVar49,auVar31);
      auVar31 = vpshufd_avx512vl(auVar34,0xf5);
      auVar27 = vpshufd_avx512vl(auVar27,0xf5);
      auVar27 = vpmuludq_avx512vl(auVar27,auVar31);
      auVar31 = vpsrlq_avx512vl(auVar27,0x20);
      auVar34 = vpmuludq_avx512vl(auVar28,auVar37);
      auVar38 = vpsrlq_avx512vl(auVar34,0x20);
      auVar49 = vpaddq_avx512vl(auVar49,auVar38);
      auVar38 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(puVar15 + uVar14 * 4 + -0x30));
      auVar23 = vpaddq_avx512vl(auVar23,auVar49);
      auVar49 = vpshufd_avx512vl(auVar37,0xf5);
      auVar28 = vpshufd_avx512vl(auVar28,0xf5);
      auVar37 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar1->random_coeff + uVar14 + 0x30));
      auVar28 = vpmuludq_avx512vl(auVar28,auVar49);
      auVar49 = vpsrlq_avx512vl(auVar28,0x20);
      auVar39 = vpmuludq_avx512vl(auVar38,auVar37);
      auVar40 = vpsrlq_avx512vl(auVar39,0x20);
      auVar31 = vpaddq_avx512vl(auVar31,auVar40);
      auVar49 = vpaddq_avx512vl(auVar31,auVar49);
      auVar31 = vpshufd_avx512vl(auVar37,0xf5);
      auVar37 = vpshufd_avx512vl(auVar38,0xf5);
      auVar38 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(puVar15 + uVar14 * 4 + -0x20));
      auVar31 = vpmuludq_avx512vl(auVar37,auVar31);
      auVar37 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar1->random_coeff + uVar14 + 0x34));
      auVar40 = vpmuludq_avx512vl(auVar38,auVar37);
      auVar37 = vpshufd_avx512vl(auVar37,0xf5);
      auVar38 = vpshufd_avx512vl(auVar38,0xf5);
      auVar37 = vpmuludq_avx512vl(auVar38,auVar37);
      auVar38 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar1->random_coeff + uVar14 + 0x38));
      auVar41 = vpsrlq_avx512vl(auVar40,0x20);
      auVar49 = vpaddq_avx512vl(auVar49,auVar41);
      auVar41 = vpsrlq_avx512vl(auVar31,0x20);
      auVar49 = vpaddq_avx512vl(auVar49,auVar41);
      auVar41 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(puVar15 + uVar14 * 4 + -0x10));
      auVar42 = vpmuludq_avx512vl(auVar41,auVar38);
      auVar46 = vpsrlq_avx(auVar42,0x20);
      auVar49 = vpaddq_avx512vl(auVar49,auVar46);
      auVar46 = vpsrlq_avx512vl(auVar37,0x20);
      auVar49 = vpaddq_avx512vl(auVar49,auVar46);
      auVar41 = vpshufd_avx512vl(auVar41,0xf5);
      auVar46 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(puVar15 + uVar14 * 4));
      auVar23 = vpaddq_avx512vl(auVar23,auVar49);
      auVar49 = vpshufd_avx512vl(auVar38,0xf5);
      auVar38 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar1->random_coeff + uVar14 + 0x3c));
      uVar14 = uVar14 + 0x40;
      auVar49 = vpmuludq_avx512vl(auVar41,auVar49);
      auVar41 = vpsrlq_avx512vl(auVar49,0x20);
      auVar43 = vpmuludq_avx512vl(auVar46,auVar38);
      auVar47 = vpsrlq_avx(auVar43,0x20);
      auVar49 = vpaddq_avx512vl(auVar43,auVar49);
      auVar41 = vpaddq_avx512vl(auVar47,auVar41);
      auVar38 = vpshufd_avx512vl(auVar38,0xf5);
      auVar46 = vpshufd_avx512vl(auVar46,0xf5);
      auVar38 = vpmuludq_avx512vl(auVar46,auVar38);
      auVar46 = vpsrlq_avx512vl(auVar38,0x20);
      auVar38 = vpaddq_avx512vl(auVar49,auVar38);
      auVar49 = vpaddq_avx512vl(auVar41,auVar46);
      auVar23 = vpaddq_avx512vl(auVar23,auVar49);
      auVar49 = vpaddq_avx(auVar3,auVar7);
      auVar44 = vpaddq_avx(auVar8,auVar44);
      auVar44 = vpaddq_avx(auVar44,auVar49);
      auVar49 = vpaddq_avx(auVar5,auVar2);
      auVar49 = vpaddq_avx(auVar49,auVar4);
      auVar44 = vpaddq_avx(auVar44,auVar49);
      auVar49 = vpaddq_avx(auVar48,auVar29);
      auVar49 = vpaddq_avx(auVar9,auVar49);
      auVar49 = vpaddq_avx(auVar50,auVar49);
      auVar44 = vpaddq_avx(auVar44,auVar49);
      auVar49 = vpaddq_avx(auVar51,auVar30);
      auVar49 = vpaddq_avx(auVar33,auVar49);
      auVar49 = vpaddq_avx(auVar6,auVar49);
      auVar49 = vpaddq_avx512vl(auVar49,auVar32);
      auVar44 = vpaddq_avx(auVar44,auVar49);
      auVar49 = vpaddq_avx512vl(auVar25,auVar35);
      auVar49 = vpaddq_avx512vl(auVar49,auVar24);
      auVar49 = vpaddq_avx512vl(auVar49,auVar36);
      auVar49 = vpaddq_avx512vl(auVar49,auVar26);
      auVar49 = vpaddq_avx512vl(auVar49,auVar34);
      auVar44 = vpaddq_avx(auVar44,auVar49);
      auVar49 = vpaddq_avx512vl(auVar27,auVar39);
      auVar49 = vpaddq_avx512vl(auVar49,auVar28);
      auVar49 = vpaddq_avx512vl(auVar49,auVar40);
      auVar49 = vpaddq_avx512vl(auVar49,auVar31);
      auVar49 = vpaddq_avx(auVar49,auVar42);
      auVar49 = vpaddq_avx512vl(auVar49,auVar37);
      auVar44 = vpaddq_avx(auVar44,auVar49);
      auVar44 = vpaddq_avx(auVar44,auVar38);
      auVar45 = ZEXT1664(auVar44);
    }
    auVar49 = vpunpckhqdq_avx512vl(auVar44,auVar23);
    auVar23 = vpunpcklqdq_avx512vl(auVar44,auVar23);
    auVar23 = vpaddq_avx(auVar23,auVar49);
    lVar19 = vpextrq_avx(auVar23,1);
    lVar19 = (ulong)(uint)(auVar23._4_4_ - (int)lVar19) + lVar19;
    uVar14 = lVar19 << 0x20 | auVar23._0_8_ & 0xffffffff;
    uVar20 = uVar14 + prVar1->const_term;
    lVar22 = (uVar20 >> 0x20) * 0xf;
    uVar10 = ((int)((ulong)lVar19 >> 0x20) + (uint)CARRY8(uVar14,prVar1->const_term)) * 0xe1 +
             (int)((ulong)lVar22 >> 0x20) * 0xf + 0xf;
    uVar17 = (uint)uVar20;
    uVar12 = uVar10 + uVar17;
    uVar11 = (uint)lVar22;
    uVar13 = uVar12 - uVar11;
    iVar18 = (CARRY4(uVar10,uVar17) + 1) - (uint)(uVar12 < uVar11);
    if (uVar13 < 0x1e) {
      if (iVar18 != 0) {
        uVar13 = iVar18 * -0xf + -0xf + uVar13;
      }
    }
    else {
      uVar13 = uVar13 + iVar18 * -0xf;
    }
    allValues[uVar16] = (ulong)uVar13;
    puVar15 = puVar15 + 0x200;
  }
  tail = (ushort *)(chars + (cnt & 0xfffffe00));
  constTerm = *(ULARGE_INTEGER__XX *)this->curr_rd;
  coeff = (ULARGE_INTEGER__XX *)this->curr_rd + 2;
  switch(cnt & 0x1ff) {
  case 0:
    uVar16 = 1;
    break;
  case 1:
    uVar16 = (ulong)((byte)*tail | 0x100);
    break;
  case 2:
    uVar16 = (ulong)(*tail | 0x10000);
    break;
  case 3:
    uVar16 = (ulong)((uint)(byte)tail[1] * 0x10000 + 0x1000000 + (uint)*tail);
    break;
  default:
    local_b0 = (undefined1  [8])
               hash_of_beginning_of_string_chunk_type2_noinline
                         (this,(uint32_t *)&coeff->QuadPart,constTerm,(uchar *)tail,cnt & 0x1ff);
    goto LAB_0017bb29;
  }
  uVar16 = uVar16 * (coeff->field_0).LowPart;
  lVar22 = (constTerm.QuadPart + uVar16 >> 0x20) * 0xf;
  ctr._0_4_ = (uint)CARRY8(constTerm.QuadPart,uVar16);
  uVar13 = (int)((ulong)lVar22 >> 0x20) * 0xf + 0xf + (uint)ctr * 0xe1;
  local_b0._0_4_ = (undefined4)(constTerm.QuadPart + uVar16);
  uVar11 = uVar13 + local_b0._0_4_;
  uVar10 = (uint)lVar22;
  uVar12 = uVar11 - uVar10;
  iVar18 = (CARRY4(uVar13,local_b0._0_4_) + 1) - (uint)(uVar11 < uVar10);
  local_b0 = SUB98(CONCAT54(CONCAT14(CARRY8(constTerm.QuadPart,uVar16),iVar18),uVar12),0);
  if (uVar12 < 0x1e) {
    if (iVar18 != 0) {
      iVar18 = iVar18 * -0xf + -0xf;
      goto LAB_0017bb1b;
    }
  }
  else {
    iVar18 = iVar18 * -0xf;
LAB_0017bb1b:
    local_b0._4_4_ = 0;
    local_b0._0_4_ = iVar18 + uVar12;
  }
LAB_0017bb29:
  allValues[uVar21] = (uint64_t)local_b0;
  uVar16 = (ulong)((cnt >> 9) + 1);
  prVar1 = this->curr_rd;
  ctr = 0;
  local_b0 = (undefined1  [8])prVar1[1].const_term;
  if (cnt < 0x7e00) {
    lVar22 = 0;
    for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
      uVar14 = (ulong)(uint)allValues[uVar21] * (ulong)prVar1[1].random_coeff[uVar21];
      ctr = ctr + CARRY8((ulong)local_b0,uVar14);
      local_b0 = (undefined1  [8])((long)local_b0 + uVar14);
      lVar22 = lVar22 + (ulong)prVar1[1].random_coeff[uVar21];
    }
    uVar16 = prVar1[1].cachedSum - lVar22;
  }
  else {
    for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
      uVar20 = (ulong)(uint)allValues[uVar14] * (ulong)prVar1[1].random_coeff[uVar14];
      ctr = ctr + CARRY8((ulong)local_b0,uVar20);
      local_b0 = (undefined1  [8])((long)local_b0 + uVar20);
    }
    uVar16 = 0;
    for (lVar22 = uVar21 + 0x89; lVar22 - 0x88U < 0x80; lVar22 = lVar22 + 1) {
      uVar16 = uVar16 + prVar1->random_coeff[lVar22 + -4];
    }
  }
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar16;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = prVar1->const_term;
  _local_b0 = auVar23 * auVar44 + _local_b0;
  uVar13 = (int)((ulong)(uint)local_b0._4_4_ * 0xf >> 0x20) * 0xf + 0xf + (uint)ctr * 0xe1;
  uVar11 = uVar13 + local_b0._0_4_;
  uVar10 = (uint)((ulong)(uint)local_b0._4_4_ * 0xf);
  uVar12 = uVar11 - uVar10;
  iVar18 = (CARRY4(uVar13,local_b0._0_4_) + 1) - (uint)(uVar11 < uVar10);
  local_b0._4_4_ = iVar18;
  local_b0._0_4_ = uVar12;
  if (uVar12 < 0x1e) {
    if (iVar18 == 0) goto LAB_0017bc46;
    iVar18 = iVar18 * -0xf + -0xf;
  }
  else {
    iVar18 = iVar18 * -0xf;
  }
  local_b0._4_4_ = 0;
  local_b0._0_4_ = iVar18 + uVar12;
LAB_0017bc46:
  if ((ulong)local_b0 >> 0x20 == 0) {
    uVar13 = ((uint)((ulong)local_b0 >> 0xd) & 0x7ffff ^ local_b0._0_4_) * -0x54c41ab1;
    local_b0 = (undefined1  [8])(ulong)(uVar13 >> 0x10 ^ uVar13);
  }
  return SUB84(local_b0,0);
}

Assistant:

NOINLINE uint32_t _hash_noRecursionNoInline_forLessThan8Chunks(const unsigned char* chars, unsigned int cnt) const
  {
			uint64_t allValues[ 8 ];
			uint64_t tmp_hash;
			unsigned int i;
			// process full chunks
			for ( i=0; i<(cnt>>PMPML_CHUNK_SIZE_BYTES_LOG2); i++ )
			{
				allValues[ i ] = hash_of_string_chunk_compact( curr_rd[0].random_coeff, *(ULARGE_INTEGER__XX*)(&(curr_rd[0].const_term)), ((const uint32_t*)(chars)) + ( i << PMPML_CHUNK_SIZE_LOG2 ) );
			}
			// process remaining incomplete chunk(s)
			// note: if string size is a multiple of chunk size, we create a new chunk (1,0,0,...0),
			// so THIS PROCESSING IS ALWAYS PERFORMED
			unsigned int tailCnt = cnt & ( PMPML_CHUNK_SIZE_BYTES - 1 );
			const unsigned char* tail = chars + ( (cnt>>PMPML_CHUNK_SIZE_BYTES_LOG2) << PMPML_CHUNK_SIZE_BYTES_LOG2 );
			if ( tailCnt < 4 )
				allValues[ i ] = hash_of_beginning_of_string_chunk_size03( curr_rd[0].random_coeff, *(ULARGE_INTEGER__XX*)(&(curr_rd[0].const_term)), tail, tailCnt );
			else
				allValues[ i ] = hash_of_beginning_of_string_chunk_type2_noinline( curr_rd[0].random_coeff, *(ULARGE_INTEGER__XX*)(&(curr_rd[0].const_term)), tail, tailCnt );
//			allValues[ i ] = hash_of_beginning_of_string_chunk_type2( curr_rd[0].random_coeff, *(ULARGE_INTEGER__XX*)(&(curr_rd[0].const_term)), tail, tailCnt );

			tmp_hash = hash_of_num_chunk_incomplete( curr_rd[ 1 ].random_coeff,
							*(ULARGE_INTEGER__XX*)(&(curr_rd[1].const_term)),
							*(ULARGE_INTEGER__XX*)(&(curr_rd[0].const_term)),
							*(ULARGE_INTEGER__XX*)(&(curr_rd[1].cachedSum)),
							allValues,
							i+1);

			if ( ( tmp_hash >> 32 ) == 0 ) //LIKELY
			{
				return fmix32_short( (uint32_t)tmp_hash );
			}
			return (uint32_t)tmp_hash;
  }